

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain.hpp
# Opt level: O3

void __thiscall
so_5::mchain_props::details::receive_actions_performer_t<so_5::details::handlers_bunch_t<1UL>_>::
handle_next(receive_actions_performer_t<so_5::details::handlers_bunch_t<1UL>_> *this,
           duration_t empty_timeout)

{
  atomic_refcounted_t *paVar1;
  abstract_message_chain_t *paVar2;
  bool bVar3;
  extraction_status_t eVar4;
  receive_actions_performer_t<so_5::details::handlers_bunch_t<1UL>_> *extraout_RDX;
  anon_class_16_2_7f447b8b lambda;
  demand_t extracted_demand;
  type_index local_20;
  message_ref_t local_18;
  invocation_type_t local_10;
  
  local_20._M_target = (type_info *)&void::typeinfo;
  local_18.m_obj = (message_t *)0x0;
  local_10 = event;
  paVar2 = (this->m_params->m_chain).m_obj;
  eVar4 = (*(paVar2->super_abstract_message_box_t)._vptr_abstract_message_box_t[0xc])
                    (paVar2,&local_20,empty_timeout.__r);
  this->m_status = eVar4;
  if (eVar4 == chain_closed) {
    if ((this->m_params->super_mchain_bulk_processing_params_t<so_5::mchain_receive_params_t>).
        m_chain_closed_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
      lambda.this = extraout_RDX;
      lambda.handler = (chain_closed_handler *)this;
      so_5::details::
      invoke_noexcept_code<so_5::mchain_props::details::receive_actions_performer_t<so_5::details::handlers_bunch_t<1ul>>::handle_next(std::chrono::duration<long,std::ratio<1l,1000000000l>>)::_lambda()_1_>
                ((details *)
                 &(this->m_params->
                  super_mchain_bulk_processing_params_t<so_5::mchain_receive_params_t>).
                  m_chain_closed_handler,lambda);
    }
  }
  else if (eVar4 == msg_extracted) {
    this->m_extracted_messages = this->m_extracted_messages + 1;
    bVar3 = so_5::details::handlers_bunch_basics_t::find_and_use_handler
                      (this->m_bunch->m_handlers,this->m_bunch->m_handlers + 1,&local_20,&local_18,
                       local_10);
    if (bVar3) {
      this->m_handled_messages = this->m_handled_messages + 1;
    }
  }
  if (local_18.m_obj != (message_t *)0x0) {
    LOCK();
    paVar1 = &(local_18.m_obj)->super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
       (local_18.m_obj != (message_t *)0x0)) {
      (*(local_18.m_obj)->_vptr_message_t[1])();
    }
  }
  return;
}

Assistant:

void
		handle_next( duration_t empty_timeout )
			{
				demand_t extracted_demand;
				m_status = m_params.chain()->extract(
						extracted_demand, empty_timeout );

				if( extraction_status_t::msg_extracted == m_status )
					{
						++m_extracted_messages;
						const bool handled = m_bunch.handle(
								extracted_demand.m_msg_type,
								extracted_demand.m_message_ref,
								extracted_demand.m_demand_type );
						if( handled )
							++m_handled_messages;
					}
				// Since v.5.5.17 we must check presence of chain-closed handler.
				// This handler must be used if chain is closed.
				else if( extraction_status_t::chain_closed == m_status )
					{
						if( const auto & handler = m_params.closed_handler() )
							so_5::details::invoke_noexcept_code(
								[&handler, this] {
									handler( m_params.chain() );
								} );
					}
			}